

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SetBbrDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,BbrDataset *aDataset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Error local_678;
  ErrorCode local_650;
  anon_class_1_0_00000001 local_64a;
  v10 local_649;
  v10 *local_648;
  size_t local_640;
  string local_638;
  allocator local_611;
  string local_610;
  ResponseHandler local_5f0;
  ErrorCode local_5cc;
  Error local_5c8;
  ErrorCode local_59c;
  Error local_598;
  ErrorCode local_56c;
  Tlv local_568;
  Error local_548;
  ErrorCode local_520;
  allocator local_519;
  string local_518;
  Error local_4f8;
  anon_class_1_0_00000001 local_4ca;
  v10 local_4c9;
  v10 *local_4c8;
  size_t local_4c0;
  string local_4b8;
  Error local_498;
  anon_class_1_0_00000001 local_46a;
  v10 local_469;
  v10 *local_468;
  size_t local_460;
  string local_458;
  Error local_438;
  anon_class_1_0_00000001 local_40a;
  v10 local_409;
  v10 *local_408;
  size_t local_400;
  string local_3f8;
  Error local_3d8;
  undefined1 local_3b0 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_380 [8];
  Request request;
  Error error;
  BbrDataset *aDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_2a0 [16];
  v10 *local_290;
  ulong local_288;
  v10 *local_280;
  size_t sStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  CommissionerImpl **local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_380,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_3b0,aHandler);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    SetBbrDataset::anon_class_1_0_00000001::operator()(&local_40a);
    local_178 = &local_408;
    local_180 = &local_409;
    bVar5 = ::fmt::v10::operator()(local_180);
    local_400 = bVar5.size_;
    local_408 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_188 = &local_3f8;
    local_198 = local_408;
    sStack_190 = local_400;
    local_140 = &local_198;
    local_1a8 = local_408;
    local_1a0 = local_400;
    local_138 = local_1a8;
    sStack_130 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c0 = local_1b8;
    local_c8 = local_1c8;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    local_b8 = local_c8;
    local_a8 = local_c0;
    local_10 = local_c8;
    ::fmt::v10::vformat_abi_cxx11_(&local_3f8,local_1a8,fmt,args);
    Error::Error(&local_3d8,kInvalidState,&local_3f8);
    Error::operator=((Error *)&request.mEndpoint,&local_3d8);
    Error::~Error(&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
    if ((uVar2 & 1) == 0) {
      SetBbrDataset::anon_class_1_0_00000001::operator()(&local_46a);
      local_168 = &local_468;
      local_170 = &local_469;
      bVar5 = ::fmt::v10::operator()(local_170);
      local_460 = bVar5.size_;
      local_468 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1d0 = &local_458;
      local_1e0 = local_468;
      sStack_1d8 = local_460;
      local_120 = &local_1e0;
      local_1f0 = local_468;
      local_1e8 = local_460;
      local_118 = local_1f0;
      sStack_110 = local_1e8;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_98 = local_200;
      local_a0 = local_218;
      local_88 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_1e8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_a0;
      local_90 = local_a0;
      local_80 = local_98;
      local_18 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_458,local_1f0,fmt_00,args_00);
      Error::Error(&local_438,kInvalidState,&local_458);
      Error::operator=((Error *)&request.mEndpoint,&local_438);
      Error::~Error(&local_438);
      std::__cxx11::string::~string((string *)&local_458);
    }
    else if ((aDataset->mPresentFlags & 0x2000) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_518,"/c/bs",&local_519);
      coap::Message::SetUriPath(&local_4f8,(Message *)local_380,&local_518);
      pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_4f8);
      local_520 = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_520);
      Error::~Error(&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      if (!bVar1) {
        iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv(&local_568,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
        AppendTlv(&local_548,(Message *)local_380,&local_568);
        pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_548);
        local_56c = kNone;
        bVar1 = commissioner::operator!=(pEVar4,&local_56c);
        Error::~Error(&local_548);
        tlv::Tlv::~Tlv(&local_568);
        if (!bVar1) {
          EncodeBbrDataset(&local_598,(Request *)local_380,aDataset);
          pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_598);
          local_59c = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_59c);
          Error::~Error(&local_598);
          if (!bVar1) {
            uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
            if ((uVar2 & 1) != 0) {
              SignRequest(&local_5c8,this,(Request *)local_380,kMeshCoP,true);
              pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_5c8);
              local_5cc = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_5cc);
              Error::~Error(&local_5c8);
              if (bVar1) goto LAB_0027202d;
            }
            std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
            function<ot::commissioner::CommissionerImpl::SetBbrDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::BbrDataset_const&)::__2&,void>
                      ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                        *)&local_5f0,(anon_class_32_1_d0c21527 *)local_3b0);
            ProxyClient::SendRequest
                      (&this->mProxyClient,(Request *)local_380,&local_5f0,0xfc00,0xf0bf);
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            ~function(&local_5f0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_610,"mgmt",&local_611);
            SetBbrDataset::anon_class_1_0_00000001::operator()(&local_64a);
            local_148 = &local_648;
            local_150 = &local_649;
            bVar5 = ::fmt::v10::operator()(local_150);
            local_640 = bVar5.size_;
            local_648 = (v10 *)bVar5.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_270 = &local_638;
            local_280 = local_648;
            sStack_278 = local_640;
            local_e0 = &local_280;
            local_290 = local_648;
            local_288 = local_640;
            local_d8 = local_290;
            sStack_d0 = local_288;
            this_local = (CommissionerImpl *)
                         ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
            ;
            local_48 = local_2a0;
            local_50 = &this_local;
            local_38 = 0;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_288;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_50;
            local_40 = local_50;
            local_30 = local_48;
            local_28 = local_50;
            ::fmt::v10::vformat_abi_cxx11_(&local_638,local_290,fmt_02,args_02);
            Log(kDebug,&local_610,&local_638);
            std::__cxx11::string::~string((string *)&local_638);
            std::__cxx11::string::~string((string *)&local_610);
            std::allocator<char>::~allocator((allocator<char> *)&local_611);
          }
        }
      }
    }
    else {
      SetBbrDataset::anon_class_1_0_00000001::operator()(&local_4ca);
      local_158 = &local_4c8;
      local_160 = &local_4c9;
      bVar5 = ::fmt::v10::operator()(local_160);
      local_4c0 = bVar5.size_;
      local_4c8 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_220 = &local_4b8;
      local_230 = local_4c8;
      sStack_228 = local_4c0;
      local_100 = &local_230;
      local_240 = local_4c8;
      local_238 = local_4c0;
      local_f8 = local_240;
      sStack_f0 = local_238;
      local_268[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_70 = local_250;
      local_78 = local_268;
      local_60 = 0;
      fmt_01.size_ = 0;
      fmt_01.data_ = (char *)local_238;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_78;
      local_68 = local_78;
      local_58 = local_70;
      local_20 = local_78;
      ::fmt::v10::vformat_abi_cxx11_(&local_4b8,local_240,fmt_01,args_01);
      Error::Error(&local_498,kInvalidArgs,&local_4b8);
      Error::operator=((Error *)&request.mEndpoint,&local_498);
      Error::~Error(&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
    }
  }
LAB_0027202d:
  local_650 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_650);
  if (bVar1) {
    Error::Error(&local_678,(Error *)&request.mEndpoint);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_678);
    Error::~Error(&local_678);
  }
  SetBbrDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::BbrDataset_const&)::
  $_2::~__2((__2 *)local_3b0);
  coap::Message::~Message((Message *)local_380);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::SetBbrDataset(ErrorHandler aHandler, const BbrDataset &aDataset)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_SET.req is only valid in CCM mode"));
    VerifyOrExit((aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit) == 0,
                 error = ERROR_INVALID_ARGS("trying to set Registrar IPv6 Address which is read-only"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodeBbrDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}